

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O0

Vector4d * __thiscall
RigidBodyDynamics::Math::Quaternion::omegaToQDot(Quaternion *this,Vector3d *omega)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  double *scalar;
  Vector4d *in_RDI;
  Matrix43 m;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  *in_stack_fffffffffffffe68;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *in_stack_fffffffffffffe70;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>_>
  *this_01;
  StorageBaseType *matrix;
  
  Eigen::Matrix<double,_4,_3,_0,_4,_3>::Matrix((Matrix<double,_4,_3,_0,_4,_3> *)0x6e5326);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (in_stack_fffffffffffffe70,(Index)in_stack_fffffffffffffe68);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e5353);
  *pSVar3 = (Scalar)this_00;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e53a3);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e53dc);
  *pSVar3 = (Scalar)other;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  this_01 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>_>
             *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e5415);
  *pSVar3 = (Scalar)this_01;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e544d);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e549d);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e54ed);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e5526);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  matrix = (StorageBaseType *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e555e);
  *pSVar3 = (Scalar)matrix;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  scalar = (double *)((ulong)*pdVar2 ^ 0x8000000000000000);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e55ad);
  *pSVar3 = (Scalar)scalar;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e55fe);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)in_stack_fffffffffffffe68);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_1>::operator()
                     (this_00,(Index)in_stack_fffffffffffffe68,0x6e564f);
  *pSVar3 = -dVar1;
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,3,0,4,3>const>const,Eigen::Matrix<double,4,3,0,4,3>const>>
  ::operator*(this_01,other);
  Vector4_t::
  Vector4_t<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,3,0,4,3>const>const,Eigen::Matrix<double,4,3,0,4,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
            ((Vector4_t *)this_00,in_stack_fffffffffffffe68);
  Quaternion((Quaternion *)this_00,(Vector4d *)in_stack_fffffffffffffe68);
  Vector4_t::Vector4_t((Vector4_t *)this_00,(Vector4_t *)in_stack_fffffffffffffe68);
  return in_RDI;
}

Assistant:

Vector4d omegaToQDot(const Vector3d& omega) const {
      Math::Matrix43 m;
      m(0, 0) =  (*this)[3];   m(0, 1) = -(*this)[2];   m(0, 2) =  (*this)[1];
      m(1, 0) =  (*this)[2];   m(1, 1) =  (*this)[3];   m(1, 2) = -(*this)[0];
      m(2, 0) = -(*this)[1];   m(2, 1) =  (*this)[0];   m(2, 2) =  (*this)[3];
      m(3, 0) = -(*this)[0];   m(3, 1) = -(*this)[1];   m(3, 2) = -(*this)[2];
      return Quaternion(0.5 * m * omega);
    }